

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator::
enterNode(FastInstancesIterator *this,Node **curr)

{
  Node *pNVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  NodeAlgorithm elem;
  int iVar5;
  undefined4 extraout_var;
  Node *pNVar6;
  Node *elem_00;
  Top TVar7;
  TermList local_40;
  TermSpec querySpec;
  
  pNVar1 = *curr;
  elem = (*pNVar1->_vptr_Node[5])(pNVar1);
  querySpec.q = false;
  querySpec.t._content = 2;
  bVar4 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::
          findSpecVarBinding(&this->_subst,*(uint *)&pNVar1[1]._vptr_Node,&querySpec);
  local_40 = querySpec.t;
  if (!bVar4) {
    local_40._content = 1;
  }
  *curr = (Node *)0x0;
  if (elem != UNSORTED_LIST) {
    if ((local_40._content & 3) == 0) {
      TVar7 = Kernel::TermList::top(&local_40);
      iVar5 = (*pNVar1->_vptr_Node[10])
                        (pNVar1,TVar7._inner._inner._0_8_,(ulong)(TVar7._inner._inner._8_4_ & 0xff),
                         0);
      if ((long *)CONCAT44(extraout_var,iVar5) == (long *)0x0) {
        pNVar6 = *curr;
      }
      else {
        pNVar6 = *(Node **)CONCAT44(extraout_var,iVar5);
        *curr = pNVar6;
      }
      elem_00 = (Node *)0x0;
    }
    else {
      plVar2 = *(long **)(pNVar1[1]._term._content + 8);
      pNVar6 = (Node *)*plVar2;
      *curr = pNVar6;
      elem_00 = (Node *)plVar2[1];
    }
    if (pNVar6 != (Node *)0x0) {
      Lib::Stack<unsigned_int>::push(&this->_specVarNumbers,*(uint *)&pNVar1[1]._vptr_Node);
    }
    if (elem_00 == (Node *)0x0) {
      return false;
    }
    goto LAB_002d6e3b;
  }
  bVar4 = (local_40._content & 3) == 0;
  if (bVar4) {
    elem_00 = pNVar1 + 1;
    do {
      elem_00 = (Node *)&elem_00->_term;
      pNVar6 = (Node *)((TermList *)elem_00)->_content;
      if (pNVar6 == (Node *)0x0) goto LAB_002d6d85;
      uVar3 = (pNVar6->_term)._content;
    } while (((uVar3 & 3) != 0) || (*(int *)(uVar3 + 8) != *(int *)(local_40._content + 8)));
    *curr = pNVar6;
LAB_002d6e1b:
    Lib::Stack<unsigned_int>::push(&this->_specVarNumbers,*(uint *)&pNVar1[1]._vptr_Node);
  }
  else {
    pNVar6 = (Node *)pNVar1[1]._term._content;
    *curr = pNVar6;
    elem_00 = pNVar1 + 2;
    if (pNVar6 != (Node *)0x0) goto LAB_002d6e1b;
LAB_002d6d85:
    bVar4 = false;
  }
  if (bVar4) {
    return false;
  }
  if (elem_00->_vptr_Node == (_func_int **)0x0) {
    return false;
  }
  elem = UNSORTED_LIST;
LAB_002d6e3b:
  Lib::Stack<void_*>::push(&this->_alternatives,elem_00);
  Lib::
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>::
  push(&this->_nodeTypes,elem);
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::enterNode(Node*& curr)
{
  ASS(!curr->isLeaf());

  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList query;
  typename InstMatcher::TermSpec querySpec;
  //here we are interested only in the top functor or the fact that the query is a variable
  //so we can discard the information about term origin
  if(_subst.findSpecVarBinding(inode->childVar, querySpec)) {
    query=querySpec.t;
  }
  else {
    query.makeVar(0);//just an arbitrary variable so that anything will match
  }

  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    ASS(*nl); //inode is not empty
    bool noAlternatives=false;
    if(query.isTerm()) {
      unsigned bindingFunctor=query.term()->functor();
      //let's skip terms that don't have the same top functor...
      while(*nl && (!(*nl)->term().isTerm() || (*nl)->term().term()->functor()!=bindingFunctor)) {
        nl++;
      }

      if(*nl) {
	//we've found the term with the same top functor
	ASS_EQ((*nl)->term().term()->functor(),bindingFunctor);
        curr=*nl;
        noAlternatives=true; //there is at most one term with each top functor
      }
    } else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=*nl;
      nl++;
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl && !noAlternatives) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    ASS(nl); //inode is not empty
    if(query.isTerm()) {
      //only term with the same top functor will be matched by a term
      Node** byTop=inode->childByTop(query.top(), false);
      if(byTop) {
	curr=*byTop;
      }
      nl=0;
    }
    else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=nl->head();
      nl=nl->tail();
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}